

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint64_t absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                   (ulong state,byte *first,size_t len)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  
  if (len < 9) {
    if (len < 4) {
      if (len == 0) {
        return state;
      }
      uVar4 = (ulong)first[len >> 1] << 8 | (ulong)first[len - 1] | (ulong)*first << 0x10;
    }
    else {
      uVar4 = CONCAT44(*(undefined4 *)first,*(undefined4 *)(first + (len - 4)));
    }
    uVar4 = (uVar4 ^ state) * -0x234dd359734ecb13;
    uVar3 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  }
  else {
    if (0x400 < len) {
      uVar3 = CombineLargeContiguousImpl32(state,first,len);
      return uVar3;
    }
    uVar2 = CityHash32((char *)first,len);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2 ^ state;
    uVar3 = SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),8) ^
            SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),0);
  }
  return uVar3;
}

Assistant:

inline uint64_t MixingHashState::CombineContiguousImpl(
    uint64_t state, const unsigned char* first, size_t len,
    std::integral_constant<int, 4> /* sizeof_size_t */) {
  // For large values we use CityHash, for small ones we just use a
  // multiplicative hash.
  if (len <= 8) {
    return CombineSmallContiguousImpl(state, first, len);
  }
  if (ABSL_PREDICT_TRUE(len <= PiecewiseChunkSize())) {
    return Mix(state ^ hash_internal::CityHash32(
                           reinterpret_cast<const char*>(first), len),
               kMul);
  }
  return CombineLargeContiguousImpl32(state, first, len);
}